

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::~BasicResult
          (BasicResult<Catch::clara::detail::ParseState> *this)

{
  BasicResult<Catch::clara::detail::ParseState> *this_local;
  
  ~BasicResult(this);
  operator_delete(this);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }